

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Drive.cpp
# Opt level: O0

void __thiscall Storage::Disk::Drive::invalidate_track(Drive *this)

{
  bool bVar1;
  shared_ptr<Storage::Disk::PCMTrack> local_50 [2];
  shared_ptr<Storage::Disk::Track> local_30;
  shared_ptr<Storage::Disk::Track> local_20;
  Drive *local_10;
  Drive *this_local;
  
  this->random_interval_ = 0.0;
  local_10 = this;
  std::shared_ptr<Storage::Disk::Track>::shared_ptr(&local_20,(nullptr_t)0x0);
  std::shared_ptr<Storage::Disk::Track>::operator=(&this->track_,&local_20);
  std::shared_ptr<Storage::Disk::Track>::~shared_ptr(&local_20);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->patched_track_);
  if (bVar1) {
    std::shared_ptr<Storage::Disk::Track>::shared_ptr<Storage::Disk::PCMTrack,void>
              (&local_30,&this->patched_track_);
    set_track(this,&local_30);
    std::shared_ptr<Storage::Disk::Track>::~shared_ptr(&local_30);
    std::shared_ptr<Storage::Disk::PCMTrack>::shared_ptr(local_50,(nullptr_t)0x0);
    std::shared_ptr<Storage::Disk::PCMTrack>::operator=(&this->patched_track_,local_50);
    std::shared_ptr<Storage::Disk::PCMTrack>::~shared_ptr(local_50);
  }
  return;
}

Assistant:

void Drive::invalidate_track() {
	random_interval_ = 0.0f;
	track_ = nullptr;
	if(patched_track_) {
		set_track(patched_track_);
		patched_track_ = nullptr;
	}
}